

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManchesterAnalyzer.cpp
# Opt level: O0

void __thiscall ManchesterAnalyzer::SynchronizeManchester(ManchesterAnalyzer *this)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  element_type *peVar5;
  size_type sVar6;
  reference pvVar7;
  iterator __first;
  iterator __last;
  uint local_78;
  U32 i;
  U32 count;
  undefined1 local_50 [8];
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> locations_to_save;
  U32 bit_value;
  bool inverted;
  BitState current_bit_state;
  U64 edge_distance;
  U64 next_edge_location;
  U64 edge_location;
  ManchesterAnalyzer *this_local;
  
  edge_location = (U64)this;
  while( true ) {
    while( true ) {
      if ((this->mSynchronized & 1U) != 0) {
        return;
      }
      Analyzer::CheckIfThreadShouldExit();
      next_edge_location = AnalyzerChannelData::GetSampleNumber();
      AnalyzerChannelData::AdvanceToNextEdge();
      lVar3 = AnalyzerChannelData::GetSampleNumber();
      uVar4 = lVar3 - next_edge_location;
      if ((uVar4 <= this->mT - this->mTError) || (this->mT + this->mTError <= uVar4)) break;
      std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::push_back
                (&this->mUnsyncedLocations,&next_edge_location);
    }
    if ((this->mT * 2 - this->mTError < uVar4) && (uVar4 < this->mT * 2 + this->mTError)) break;
    Invalidate(this);
  }
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::push_back
            (&this->mUnsyncedLocations,&next_edge_location);
  this->mSynchronized = true;
  iVar2 = AnalyzerChannelData::GetBitState();
  peVar5 = std::auto_ptr<ManchesterAnalyzerSettings>::operator->(&this->mSettings);
  bVar1 = peVar5->mInverted & 1;
  locations_to_save.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  if ((bVar1 == 1) && (iVar2 == 0)) {
    locations_to_save.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
  else if ((bVar1 == 1) && (iVar2 == 1)) {
    locations_to_save.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  }
  else if ((bVar1 == 0) && (iVar2 == 0)) {
    locations_to_save.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  }
  else if ((bVar1 == 0) && (iVar2 == 1)) {
    locations_to_save.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)local_50);
  while (sVar6 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::size
                           (&this->mUnsyncedLocations), sVar6 != 0) {
    pvVar7 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::back
                       (&this->mUnsyncedLocations);
    std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::push_back
              ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)local_50,pvVar7);
    std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::pop_back
              (&this->mUnsyncedLocations);
    sVar6 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::size
                      (&this->mUnsyncedLocations);
    if (sVar6 != 0) {
      std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::pop_back
                (&this->mUnsyncedLocations);
    }
  }
  __first = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::begin
                      ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)local_50);
  __last = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::end
                     ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)local_50);
  std::
  sort<__gnu_cxx::__normal_iterator<unsigned_long_long*,std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>>>
            ((__normal_iterator<unsigned_long_long_*,_std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>
              )__first._M_current,
             (__normal_iterator<unsigned_long_long_*,_std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>
              )__last._M_current);
  sVar6 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::size
                    ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)local_50);
  for (local_78 = 0; local_78 < (uint)sVar6; local_78 = local_78 + 1) {
    pvVar7 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                       ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)local_50,
                        (ulong)local_78);
    SaveBit(this,*pvVar7,
            locations_to_save.
            super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_);
  }
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~vector
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)local_50);
  return;
}

Assistant:

void ManchesterAnalyzer::SynchronizeManchester()
{
    // we should already be on an edge, the first one out of idle.
    while( mSynchronized == false )
    {
        CheckIfThreadShouldExit();
        U64 edge_location = mManchester->GetSampleNumber();
        mManchester->AdvanceToNextEdge();
        U64 next_edge_location = mManchester->GetSampleNumber();
        U64 edge_distance = next_edge_location - edge_location;
        if( ( edge_distance > ( mT - mTError ) ) && ( edge_distance < ( mT + mTError ) ) ) // short
        {
            mUnsyncedLocations.push_back( edge_location );
        }
        else if( ( edge_distance > ( ( 2 * mT ) - mTError ) ) && ( edge_distance < ( ( 2 * mT ) + mTError ) ) ) // long
        {
            mUnsyncedLocations.push_back( edge_location );
            mSynchronized = true;
            BitState current_bit_state = mManchester->GetBitState();
            bool inverted = mSettings->mInverted;
            U32 bit_value = 0;
            if( ( inverted == true ) && ( current_bit_state == BIT_LOW ) ) // we are on a neg edge with inverted true
                bit_value = 1;                                             // the old marker will be the opposite of the current value.
            else if( ( inverted == true ) && ( current_bit_state == BIT_HIGH ) )
                bit_value = 0;
            else if( ( inverted == false ) && ( current_bit_state == BIT_LOW ) ) // we are on a neg edge with inverted false
                bit_value = 0;
            else if( ( inverted == false ) && ( current_bit_state == BIT_HIGH ) )
                bit_value = 1;
            std::vector<U64> locations_to_save;
            while( mUnsyncedLocations.size() > 0 )
            {
                locations_to_save.push_back( mUnsyncedLocations.back() );
                mUnsyncedLocations.pop_back();
                if( mUnsyncedLocations.size() > 0 )
                    mUnsyncedLocations.pop_back();
            }
            std::sort( locations_to_save.begin(), locations_to_save.end() );
            U32 count = locations_to_save.size();
            for( U32 i = 0; i < count; ++i )
                SaveBit( locations_to_save[ i ], bit_value );
            break;
        }
        else
        {
            // back to idle.
            Invalidate();
        }
    }
}